

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_histogram_Test::TestBody
          (BuilderTest_build_histogram_Test *this)

{
  Builder<prometheus::Histogram> *pBVar1;
  Family<prometheus::Histogram> *this_00;
  initializer_list<double> __l;
  allocator_type local_99;
  double local_98 [3];
  Builder<prometheus::Histogram> local_80;
  
  BuildHistogram();
  pBVar1 = detail::Builder<prometheus::Histogram>::Name(&local_80,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Histogram>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Histogram>::Labels
                     (pBVar1,&(this->super_BuilderTest).const_labels);
  this_00 = detail::Builder<prometheus::Histogram>::Register
                      (pBVar1,&(this->super_BuilderTest).registry);
  detail::Builder<prometheus::Histogram>::~Builder(&local_80);
  local_98[0] = 1.0;
  local_98[1] = 2.0;
  __l._M_len = 2;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_80,__l,&local_99);
  Family<prometheus::Histogram>::Add<std::vector<double,std::allocator<double>>>
            (this_00,&(this->super_BuilderTest).more_labels,
             (vector<double,_std::allocator<double>_> *)&local_80);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_80);
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_histogram) {
  auto& family = BuildHistogram()
                     .Name(name)
                     .Help(help)
                     .Labels(const_labels)
                     .Register(registry);
  family.Add(more_labels, Histogram::BucketBoundaries{1, 2});

  verifyCollectedLabels();
}